

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio.c
# Opt level: O1

void nni_aio_expire_loop(void *arg)

{
  nni_list *list;
  nni_aio_cancel_fn p_Var1;
  void *pvVar2;
  int iVar3;
  nni_time nVar4;
  nni_aio *pnVar5;
  nni_aio *pnVar6;
  nng_err nVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  nni_aio *pnStack_378;
  nni_aio *expires [100];
  
  nni_thr_set_name((nni_thr *)0x0,"nng:aio:expire");
  nni_mtx_lock((nni_mtx *)arg);
  list = (nni_list *)((long)arg + 0x60);
  do {
    uVar9 = *(ulong *)((long)arg + 0x110);
    nVar4 = nni_clock();
    pnVar5 = (nni_aio *)nni_list_first(list);
    if ((pnVar5 == (nni_aio *)0x0) && (*(char *)((long)arg + 0x118) == '\x01')) {
      nni_mtx_unlock((nni_mtx *)arg);
      iVar3 = 1;
    }
    else {
      if ((uVar9 <= nVar4) || ((pnVar5 != (nni_aio *)0x0 && (*(char *)((long)arg + 0x119) != '\0')))
         ) {
        *(undefined8 *)((long)arg + 0x110) = 0xffffffffffffffff;
        uVar9 = 0;
LAB_00113294:
        uVar8 = (uint)uVar9;
        if (pnVar5 != (nni_aio *)0x0) {
          do {
            if (*(char *)((long)arg + 0x119) == '\0') {
              if (pnVar5->a_expire < nVar4 && uVar8 < 100) goto LAB_001132f0;
            }
            else if (uVar8 < 100) goto LAB_001132f0;
            if (pnVar5->a_expire < *(ulong *)((long)arg + 0x110)) {
              *(nni_time *)((long)arg + 0x110) = pnVar5->a_expire;
            }
            pnVar5 = (nni_aio *)nni_list_next(list,pnVar5);
            if (pnVar5 == (nni_aio *)0x0) break;
          } while( true );
        }
        if (uVar8 != 0) {
          uVar10 = 0;
          do {
            pnVar5 = expires[uVar10 - 1];
            if (*(char *)((long)arg + 0x119) == '\x01') {
              pnVar5->a_stop = true;
              nVar7 = NNG_ESTOPPED;
            }
            else {
              nVar7 = NNG_ETIMEDOUT;
              if (pnVar5->a_expire_ok == true) {
                pnVar5->a_expire_ok = false;
                nVar7 = NNG_OK;
              }
            }
            p_Var1 = pnVar5->a_cancel_fn;
            pvVar2 = pnVar5->a_cancel_arg;
            pnVar5->a_cancel_fn = (nni_aio_cancel_fn)0x0;
            pnVar5->a_cancel_arg = (void *)0x0;
            if (pnVar5->a_sleep == true) {
              pnVar5->a_result = nVar7;
              pnVar5->a_sleep = false;
              nni_task_dispatch(&pnVar5->a_task);
            }
            else if (p_Var1 != (nni_aio_cancel_fn)0x0) {
              nni_mtx_unlock((nni_mtx *)arg);
              (*p_Var1)(pnVar5,pvVar2,nVar7);
              nni_mtx_lock((nni_mtx *)arg);
            }
            pnVar5->a_expiring = false;
            uVar10 = uVar10 + 1;
          } while (uVar9 != uVar10);
        }
        nni_cv_wake((nni_cv *)((long)arg + 0x28));
        iVar3 = 0;
        goto LAB_001133fc;
      }
      nni_cv_until((nni_cv *)((long)arg + 0x28),uVar9);
      iVar3 = 3;
    }
LAB_001133fc:
    if ((iVar3 != 0) && (iVar3 != 3)) {
      return;
    }
  } while( true );
LAB_001132f0:
  expires[uVar9 - 1] = pnVar5;
  pnVar6 = (nni_aio *)nni_list_next(list,pnVar5);
  nni_list_remove(list,pnVar5);
  pnVar5->a_expiring = true;
  pnVar5 = pnVar6;
  uVar9 = (ulong)(uVar8 + 1);
  goto LAB_00113294;
}

Assistant:

static void
nni_aio_expire_loop(void *arg)
{
	nni_aio_expire_q *q   = arg;
	nni_mtx          *mtx = &q->eq_mtx;
	nni_cv           *cv  = &q->eq_cv;
	nni_time          now;
	uint32_t          exp_idx;
	nni_aio          *expires[NNI_EXPIRE_BATCH];

	nni_thr_set_name(NULL, "nng:aio:expire");

	nni_mtx_lock(mtx);

	for (;;) {
		nni_aio *aio;
		nng_err  rv;
		nni_time next;

		next = q->eq_next;
		now  = nni_clock();

		// Each time we wake up, we scan the entire list of elements.
		// We scan forward, moving up to NNI_EXPIRE_Q_SIZE elements
		// (a batch) to a saved array of things we are going to cancel.
		// This mostly runs in O(n), provided you don't have many
		// elements (> NNI_EXPIRE_Q_SIZE) all expiring simultaneously.
		aio = nni_list_first(&q->eq_list);
		if ((aio == NULL) && (q->eq_exit)) {
			nni_mtx_unlock(mtx);
			return;
		}
		if (now < next && !(q->eq_stop && aio != NULL)) {
			// nothing to do!
			nni_cv_until(cv, next);
			continue;
		}
		q->eq_next = NNI_TIME_NEVER;
		exp_idx    = 0;
		while (aio != NULL) {
			if ((q->eq_stop || aio->a_expire < now) &&
			    (exp_idx < NNI_EXPIRE_BATCH)) {
				nni_aio *nxt;

				// This one is expiring.
				expires[exp_idx++] = aio;
				// save the next node
				nxt = nni_list_next(&q->eq_list, aio);
				nni_list_remove(&q->eq_list, aio);
				// Place a temporary hold on the aio.
				// This prevents it from being destroyed.
				aio->a_expiring = true;
				aio             = nxt;
				continue;
			}
			if (aio->a_expire < q->eq_next) {
				q->eq_next = aio->a_expire;
			}
			aio = nni_list_next(&q->eq_list, aio);
		}

		for (uint32_t i = 0; i < exp_idx; i++) {
			aio = expires[i];
			if (q->eq_stop) {
				rv          = NNG_ESTOPPED;
				aio->a_stop = true;
			} else if (aio->a_expire_ok) {
				aio->a_expire_ok = false;
				rv               = 0;
			} else {
				rv = NNG_ETIMEDOUT;
			}

			nni_aio_cancel_fn cancel_fn  = aio->a_cancel_fn;
			void             *cancel_arg = aio->a_cancel_arg;

			aio->a_cancel_fn  = NULL;
			aio->a_cancel_arg = NULL;

			// We let the cancel function handle the completion.
			// If there is no cancellation function, then we cannot
			// terminate the aio - we've tried, but it has to run
			// to its natural conclusion.
			//
			// For the special case of sleeping, we don't need to
			// drop the lock and call the cancel function, we are
			// already doing it right here!
			if (aio->a_sleep) {
				aio->a_result = rv;
				aio->a_sleep  = false;
				nni_task_dispatch(&aio->a_task);
			} else if (cancel_fn != NULL) {
				nni_mtx_unlock(mtx);
				cancel_fn(aio, cancel_arg, rv);
				nni_mtx_lock(mtx);
			}
			aio->a_expiring = false;
		}
		nni_cv_wake(cv);
	}
}